

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  uint uVar2;
  HashElem *pHVar3;
  long lVar4;
  FKey *pFVar5;
  uint h_1;
  uint h;
  uint uStack_28;
  uint local_24;
  
  if (((uint)pParse >> 0x13 & 1) == 0) {
    return 0;
  }
  if (aChange == (int *)0x0) {
    pHVar3 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,&uStack_28);
    if ((pHVar3 == (HashElem *)0x0) || (uVar2 = 1, pHVar3->data == (void *)0x0)) {
      uVar2 = (uint)(pTab->pFKey != (FKey *)0x0);
    }
  }
  else {
    for (pFVar5 = pTab->pFKey; pFVar5 != (FKey *)0x0; pFVar5 = pFVar5->pNextFrom) {
      if (0 < (long)pFVar5->nCol) {
        lVar4 = 0;
        do {
          iVar1 = *(int *)((long)&pFVar5->aCol[0].iFrom + lVar4);
          if (-1 < aChange[iVar1]) {
            return 1;
          }
          if ((chngRowid != 0) && (iVar1 == pTab->iPKey)) {
            return 1;
          }
          lVar4 = lVar4 + 0x10;
        } while ((long)pFVar5->nCol * 0x10 != lVar4);
      }
    }
    pHVar3 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,&local_24);
    if (pHVar3 != (HashElem *)0x0) {
      for (pFVar5 = (FKey *)pHVar3->data; pFVar5 != (FKey *)0x0; pFVar5 = pFVar5->pNextTo) {
        iVar1 = fkParentIsModified(pTab,pFVar5,aChange,chngRowid);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }
    }
  }
  return 0;
}